

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O3

void density::f_destroy::invoke<density_tests::SingleDerived>(void *i_object)

{
  *(undefined ***)i_object = &PTR_class_id_010673f8;
  density_tests::SingleDerived::check((SingleDerived *)i_object);
  density_tests::InstanceCounted::~InstanceCounted((InstanceCounted *)((long)i_object + 0x40));
  if (*(void **)((long)i_object + 0x20) != (void *)((long)i_object + 0x30)) {
    operator_delete(*(void **)((long)i_object + 0x20));
  }
  density_tests::PolymorphicBase::~PolymorphicBase((PolymorphicBase *)i_object);
  return;
}

Assistant:

static void invoke(void * i_object) noexcept
        {
            DENSITY_ASSUME(i_object != nullptr);
            TARGET_TYPE * obj = static_cast<TARGET_TYPE *>(i_object);
            static_assert(
              noexcept(obj->TARGET_TYPE::~TARGET_TYPE()),
              "TARGET_TYPE must be nothrow destructible");
            obj->TARGET_TYPE::~TARGET_TYPE();
        }